

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall spirv_cross::Compiler::is_vertex_like_shader(Compiler *this)

{
  ExecutionModel EVar1;
  undefined1 local_15;
  ExecutionModel model;
  Compiler *this_local;
  
  EVar1 = get_execution_model(this);
  local_15 = true;
  if (((EVar1 != ExecutionModelVertex) && (local_15 = true, EVar1 != ExecutionModelGeometry)) &&
     (local_15 = true, EVar1 != ExecutionModelTessellationControl)) {
    local_15 = EVar1 == ExecutionModelTessellationEvaluation;
  }
  return local_15;
}

Assistant:

bool Compiler::is_vertex_like_shader() const
{
	auto model = get_execution_model();
	return model == ExecutionModelVertex || model == ExecutionModelGeometry ||
	       model == ExecutionModelTessellationControl || model == ExecutionModelTessellationEvaluation;
}